

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::Encode
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this,
          KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this_local;
  
  pKVar1 = DATA_TYPE::operator<<(stream,&(this->m_X).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Y).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar1,&(this->m_Z).super_DataTypeBase);
  return;
}

Assistant:

void LE_Vector<Type>::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_X
           << KDIS_STREAM m_Y
           << KDIS_STREAM m_Z;
}